

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::StringStream<4096UL,_4096UL>::append
          (StringStream<4096UL,_4096UL> *this,char *s,size_t len)

{
  ulong __n;
  char *pcVar1;
  CompilerError *this_00;
  size_t local_50;
  size_t target_size;
  size_t avail;
  size_t len_local;
  char *s_local;
  StringStream<4096UL,_4096UL> *this_local;
  
  __n = (this->current_buffer).size - (this->current_buffer).offset;
  if (__n < len) {
    avail = len;
    len_local = (size_t)s;
    if (__n != 0) {
      memcpy((this->current_buffer).buffer + (this->current_buffer).offset,s,__n);
      len_local = (size_t)(s + __n);
      avail = len - __n;
      (this->current_buffer).offset = __n + (this->current_buffer).offset;
    }
    SmallVector<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL>::push_back
              (&this->saved_buffers,&this->current_buffer);
    if (avail < 0x1001) {
      local_50 = 0x1000;
    }
    else {
      local_50 = avail;
    }
    pcVar1 = (char *)malloc(local_50);
    (this->current_buffer).buffer = pcVar1;
    if ((this->current_buffer).buffer == (char *)0x0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Out of memory.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    memcpy((this->current_buffer).buffer,(void *)len_local,avail);
    (this->current_buffer).offset = avail;
    (this->current_buffer).size = local_50;
  }
  else {
    memcpy((this->current_buffer).buffer + (this->current_buffer).offset,s,len);
    (this->current_buffer).offset = len + (this->current_buffer).offset;
  }
  return;
}

Assistant:

void append(const char *s, size_t len)
	{
		size_t avail = current_buffer.size - current_buffer.offset;
		if (avail < len)
		{
			if (avail > 0)
			{
				memcpy(current_buffer.buffer + current_buffer.offset, s, avail);
				s += avail;
				len -= avail;
				current_buffer.offset += avail;
			}

			saved_buffers.push_back(current_buffer);
			size_t target_size = len > BlockSize ? len : BlockSize;
			current_buffer.buffer = static_cast<char *>(malloc(target_size));
			if (!current_buffer.buffer)
				SPIRV_CROSS_THROW("Out of memory.");

			memcpy(current_buffer.buffer, s, len);
			current_buffer.offset = len;
			current_buffer.size = target_size;
		}
		else
		{
			memcpy(current_buffer.buffer + current_buffer.offset, s, len);
			current_buffer.offset += len;
		}
	}